

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::HttpFixedLengthEntityReader::tryRead
          (HttpFixedLengthEntityReader *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  void *buffer_00;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> maxBytes_00;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar1;
  Promise<unsigned_long> PVar2;
  void *local_50;
  size_t local_48;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  HttpFixedLengthEntityReader *this_local;
  
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  if (*(long *)((long)buffer + 0x18) == 0) {
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,0);
    pPVar1 = extraout_RDX;
  }
  else {
    buffer_00 = *(void **)((long)buffer + 8);
    maxBytes_00 = min<unsigned_long&,unsigned_long&>
                            (&maxBytes_local,(unsigned_long *)((long)buffer + 0x18));
    min<unsigned_long&,unsigned_long&>
              ((unsigned_long *)&stack0xffffffffffffffd0,(unsigned_long *)((long)buffer + 0x18));
    HttpInputStreamImpl::tryRead
              ((HttpInputStreamImpl *)&stack0xffffffffffffffc0,buffer_00,minBytes,maxBytes_00);
    local_48 = maxBytes_local;
    local_50 = buffer;
    Promise<unsigned_long>::
    then<kj::(anonymous_namespace)::HttpFixedLengthEntityReader::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::_::PropagateException>
              ((Promise<unsigned_long> *)this,(Type *)&stack0xffffffffffffffc0,
               (PropagateException *)&local_50);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&stack0xffffffffffffffc0);
    pPVar1 = extraout_RDX_00;
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (length == 0) return size_t(0);

    return inner.tryRead(buffer, kj::min(minBytes, length), kj::min(maxBytes, length))
        .then([=](size_t amount) {
      length -= amount;
      if (length > 0 && amount < minBytes) {
        kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED,
            "premature EOF in HTTP entity body; did not reach Content-Length"));
      } else if (length == 0) {
        doneReading();
      }
      return amount;
    });
  }